

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_entry.hpp
# Opt level: O0

void __thiscall
asio::ip::basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
          (basic_resolver_entry<asio::ip::tcp> *this,endpoint_type *ep,string *host,string *service)

{
  string *in_RCX;
  string *in_RDX;
  long in_RDI;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffffb8;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffffc0;
  
  basic_endpoint<asio::ip::tcp>::basic_endpoint(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  std::__cxx11::string::string((string *)(in_RDI + 0x20),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 0x40),in_RCX);
  return;
}

Assistant:

basic_resolver_entry(const endpoint_type& ep,
      const std::string& host, const std::string& service)
    : endpoint_(ep),
      host_name_(host),
      service_name_(service)
  {
  }